

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmTarget * __thiscall
cmMakefile::GetCustomCommandTarget
          (cmMakefile *this,string *target,cmObjectLibraryCommands objLibCommands,
          cmListFileBacktrace *lfbt)

{
  pointer pcVar1;
  cmake *pcVar2;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  const_iterator cVar6;
  iterator iVar7;
  ostream *poVar8;
  PolicyID id;
  long lVar9;
  MessageType t;
  char *pcVar10;
  cmTarget *pcVar11;
  string realTarget;
  ostringstream e;
  string local_1e8;
  key_type local_1c8;
  undefined1 local_1a8 [376];
  
  pcVar1 = (target->_M_dataplus)._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + target->_M_string_length);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->AliasTargets)._M_t,target);
  if ((_Rb_tree_header *)cVar6._M_node != &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::_M_assign((string *)&local_1c8);
  }
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,&local_1c8);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    t = AUTHOR_WARNING;
    PVar5 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0040,false);
    if (PVar5 - NEW < 3) {
      bVar3 = true;
      t = FATAL_ERROR;
    }
    else if (PVar5 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)&DAT_00000028,id);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      pcVar11 = FindTargetToUse(this,target,false);
      if (pcVar11 == (cmTarget *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"No TARGET \'",0xb);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(target->_M_dataplus)._M_p,target->_M_string_length
                           );
        lVar9 = 0x25;
        pcVar10 = "\' has been created in this directory.";
      }
      else {
        bVar3 = cmTarget::IsImported(pcVar11);
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"TARGET \'",8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(target->_M_dataplus)._M_p,
                              target->_M_string_length);
          lVar9 = 0x26;
          pcVar10 = "\' is IMPORTED and does not build here.";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"TARGET \'",8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(target->_M_dataplus)._M_p,
                              target->_M_string_length);
          lVar9 = 0x24;
          pcVar10 = "\' was not created in this directory.";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar10,lVar9);
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar2,t,&local_1e8,lfbt);
      goto LAB_004c2bf5;
    }
  }
  else {
    pcVar11 = (cmTarget *)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                     ._M_cur + 0x28);
    if (objLibCommands == Reject) {
      TVar4 = cmTarget::GetType(pcVar11);
      if (TVar4 == OBJECT_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(target->_M_dataplus)._M_p,target->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                   ,0x55);
        pcVar2 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1e8,lfbt);
        goto LAB_004c2bf5;
      }
    }
    TVar4 = cmTarget::GetType(pcVar11);
    if (TVar4 != INTERFACE_LIBRARY) goto LAB_004c2c31;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(target->_M_dataplus)._M_p,target->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
               ,0x58);
    pcVar2 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1e8,lfbt);
LAB_004c2bf5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pcVar11 = (cmTarget *)0x0;
LAB_004c2c31:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return pcVar11;
}

Assistant:

cmTarget* cmMakefile::GetCustomCommandTarget(
  const std::string& target, cmObjectLibraryCommands objLibCommands,
  const cmListFileBacktrace& lfbt) const
{
  auto realTarget = target;

  auto ai = this->AliasTargets.find(target);
  if (ai != this->AliasTargets.end()) {
    realTarget = ai->second;
  }

  // Find the target to which to add the custom command.
  auto ti = this->Targets.find(realTarget);
  if (ti == this->Targets.end()) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      this->GetCMakeInstance()->IssueMessage(messageType, e.str(), lfbt);
    }

    return nullptr;
  }

  cmTarget* t = &ti->second;
  if (objLibCommands == cmObjectLibraryCommands::Reject &&
      t->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }
  if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }

  return t;
}